

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datarate_test.cc
# Opt level: O3

void __thiscall
datarate_test::anon_unknown_0::DatarateTestLarge::BasicRateTargetingVBRTest(DatarateTestLarge *this)

{
  DatarateTest *pDVar1;
  double *val1;
  bool bVar2;
  ParamType *pPVar3;
  undefined8 *puVar4;
  SEARCH_METHODS *pSVar5;
  AssertHelper local_b0;
  AssertHelper local_a8;
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  I420VideoSource video;
  
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_min_quantizer = 0;
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_max_quantizer = 0x3f;
  (this->super_DatarateTest).super_EncoderTest.cfg_.g_error_resilient = 0;
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_end_usage = AOM_VBR;
  (this->super_DatarateTest).super_EncoderTest.cfg_.g_lag_in_frames = 0;
  gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
  _vptr_TestPartResultReporterInterface =
       (_func_int **)&gtest_fatal_failure_checker.original_reporter_;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gtest_fatal_failure_checker,"hantro_collage_w352h288.yuv","");
  libaom_test::YUVVideoSource::YUVVideoSource
            (&video.super_YUVVideoSource,(string *)&gtest_fatal_failure_checker,AOM_IMG_FMT_I420,
             0x160,0x120,0x1e,1,0,0x8c);
  video.super_YUVVideoSource.super_VideoSource._vptr_VideoSource =
       (_func_int **)&PTR__YUVVideoSource_01003b10;
  if ((TestPartResultReporterInterface **)
      gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
      _vptr_TestPartResultReporterInterface != &gtest_fatal_failure_checker.original_reporter_) {
    operator_delete(gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                    _vptr_TestPartResultReporterInterface);
  }
  pPVar3 = testing::
           WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>_>
           ::GetParam();
  pDVar1 = &this->super_DatarateTest;
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_target_bitrate =
       *(uint *)(&DAT_00c4aa18 +
                (long)(pPVar3->
                      super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>
                      ).super__Tuple_impl<1UL,_libaom_test::TestMode,_int,_unsigned_int,_int>.
                      super__Tuple_impl<2UL,_int,_unsigned_int,_int>.
                      super__Tuple_impl<3UL,_unsigned_int,_int>.super__Tuple_impl<4UL,_int>.
                      super__Head_base<4UL,_int,_false>._M_head_impl * 4);
  (*(this->super_DatarateTest).super_EncoderTest._vptr_EncoderTest[0x13])(pDVar1);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
              (&gtest_fatal_failure_checker);
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      (*(pDVar1->super_EncoderTest)._vptr_EncoderTest[2])(pDVar1,&video);
    }
    bVar2 = gtest_fatal_failure_checker.has_new_fatal_failure_;
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              (&gtest_fatal_failure_checker);
    if (bVar2 == false) {
      val1 = &(this->super_DatarateTest).effective_datarate_;
      local_b0.data_ =
           (AssertHelperData *)
           ((double)(this->super_DatarateTest).super_EncoderTest.cfg_.rc_target_bitrate * 0.7);
      testing::internal::CmpHelperGE<double,double>
                ((internal *)&gtest_fatal_failure_checker,"effective_datarate_",
                 "cfg_.rc_target_bitrate * 0.7",val1,(double *)&local_b0);
      if ((char)gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                _vptr_TestPartResultReporterInterface == '\0') {
        testing::Message::Message((Message *)&local_b0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&(local_b0.data_)->line,
                   " The datarate for the file is lower than target by too much!",0x3c);
        if ((undefined8 *)
            CONCAT71(gtest_fatal_failure_checker._9_7_,
                     gtest_fatal_failure_checker.has_new_fatal_failure_) == (undefined8 *)0x0) {
          pSVar5 = "";
        }
        else {
          pSVar5 = *(SEARCH_METHODS **)
                    CONCAT71(gtest_fatal_failure_checker._9_7_,
                             gtest_fatal_failure_checker.has_new_fatal_failure_);
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_a8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/datarate_test.cc"
                   ,0x6d,(char *)pSVar5);
        testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_b0);
        testing::internal::AssertHelper::~AssertHelper(&local_a8);
        if (local_b0.data_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)local_b0.data_ + 8))();
        }
        puVar4 = (undefined8 *)
                 CONCAT71(gtest_fatal_failure_checker._9_7_,
                          gtest_fatal_failure_checker.has_new_fatal_failure_);
        if (puVar4 == (undefined8 *)0x0) goto LAB_005e7c99;
        if ((undefined8 *)*puVar4 != puVar4 + 2) {
          operator_delete((undefined8 *)*puVar4);
        }
      }
      else {
        puVar4 = (undefined8 *)
                 CONCAT71(gtest_fatal_failure_checker._9_7_,
                          gtest_fatal_failure_checker.has_new_fatal_failure_);
        if (puVar4 != (undefined8 *)0x0) {
          if ((undefined8 *)*puVar4 != puVar4 + 2) {
            operator_delete((undefined8 *)*puVar4);
          }
          operator_delete(puVar4);
        }
        local_b0.data_ =
             (AssertHelperData *)
             ((double)(this->super_DatarateTest).super_EncoderTest.cfg_.rc_target_bitrate * 1.45);
        testing::internal::CmpHelperLE<double,double>
                  ((internal *)&gtest_fatal_failure_checker,"effective_datarate_",
                   "cfg_.rc_target_bitrate * 1.45",val1,(double *)&local_b0);
        if ((char)gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                  _vptr_TestPartResultReporterInterface == '\0') {
          testing::Message::Message((Message *)&local_b0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&(local_b0.data_)->line,
                     " The datarate for the file is greater than target by too much!",0x3e);
          if ((undefined8 *)
              CONCAT71(gtest_fatal_failure_checker._9_7_,
                       gtest_fatal_failure_checker.has_new_fatal_failure_) == (undefined8 *)0x0) {
            pSVar5 = "";
          }
          else {
            pSVar5 = *(SEARCH_METHODS **)
                      CONCAT71(gtest_fatal_failure_checker._9_7_,
                               gtest_fatal_failure_checker.has_new_fatal_failure_);
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_a8,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/datarate_test.cc"
                     ,0x71,(char *)pSVar5);
          testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_b0);
          testing::internal::AssertHelper::~AssertHelper(&local_a8);
          if (local_b0.data_ != (AssertHelperData *)0x0) {
            (**(code **)(*(long *)local_b0.data_ + 8))();
          }
        }
        puVar4 = (undefined8 *)
                 CONCAT71(gtest_fatal_failure_checker._9_7_,
                          gtest_fatal_failure_checker.has_new_fatal_failure_);
        if (puVar4 == (undefined8 *)0x0) goto LAB_005e7c99;
        if ((undefined8 *)*puVar4 != puVar4 + 2) {
          operator_delete((undefined8 *)*puVar4);
        }
      }
      operator_delete(puVar4);
      goto LAB_005e7c99;
    }
  }
  testing::Message::Message((Message *)&gtest_fatal_failure_checker);
  testing::internal::AssertHelper::AssertHelper
            (&local_b0,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/datarate_test.cc"
             ,0x6c,
             "Expected: RunLoop(&video) doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
            );
  testing::internal::AssertHelper::operator=(&local_b0,(Message *)&gtest_fatal_failure_checker);
  testing::internal::AssertHelper::~AssertHelper(&local_b0);
  if (gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
      _vptr_TestPartResultReporterInterface != (_func_int **)0x0) {
    (**(code **)(*gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                  _vptr_TestPartResultReporterInterface + 8))();
  }
LAB_005e7c99:
  libaom_test::YUVVideoSource::~YUVVideoSource(&video.super_YUVVideoSource);
  return;
}

Assistant:

virtual void BasicRateTargetingVBRTest() {
    cfg_.rc_min_quantizer = 0;
    cfg_.rc_max_quantizer = 63;
    cfg_.g_error_resilient = 0;
    cfg_.rc_end_usage = AOM_VBR;
    cfg_.g_lag_in_frames = 0;

    ::libaom_test::I420VideoSource video("hantro_collage_w352h288.yuv", 352,
                                         288, 30, 1, 0, 140);
    const int bitrate_array[2] = { 400, 800 };
    cfg_.rc_target_bitrate = bitrate_array[GET_PARAM(4)];
    ResetModel();
    ASSERT_NO_FATAL_FAILURE(RunLoop(&video));
    ASSERT_GE(effective_datarate_, cfg_.rc_target_bitrate * 0.7)
        << " The datarate for the file is lower than target by too much!";
    // FIXME(jingning): Lower this test threshold after vbr mode can render
    // sufficiently accurate bit rate.
    ASSERT_LE(effective_datarate_, cfg_.rc_target_bitrate * 1.45)
        << " The datarate for the file is greater than target by too much!";
  }